

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::DragScalar(char *label,ImGuiDataType data_type,void *p_data,float v_speed,void *p_min,
                      void *p_max,char *format,float power)

{
  bool bVar1;
  long in_RCX;
  long in_R8;
  float in_XMM1_Da;
  ImGuiSliderFlags drag_flags;
  char *in_stack_00000158;
  void *in_stack_00000160;
  void *in_stack_00000168;
  float in_stack_00000174;
  void *in_stack_00000178;
  ImGuiDataType in_stack_00000184;
  char *in_stack_00000188;
  ImGuiSliderFlags in_stack_000001a0;
  
  if ((in_XMM1_Da != 1.0) || (NAN(in_XMM1_Da))) {
    bVar1 = false;
    if ((in_XMM1_Da == 1.0) && (!NAN(in_XMM1_Da))) {
      bVar1 = true;
    }
    if (!bVar1) {
      __assert_fail("power == 1.0f && \"Call function with ImGuiSliderFlags_Logarithmic flags instead of using the old \'float power\' function!\""
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_widgets.cpp"
                    ,0x9cc,
                    "bool ImGui::DragScalar(const char *, ImGuiDataType, void *, float, const void *, const void *, const char *, float)"
                   );
    }
    if (in_RCX == 0 || in_R8 == 0) {
      __assert_fail("p_min != __null && p_max != __null",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_widgets.cpp"
                    ,0x9cd,
                    "bool ImGui::DragScalar(const char *, ImGuiDataType, void *, float, const void *, const void *, const char *, float)"
                   );
    }
  }
  bVar1 = DragScalar(in_stack_00000188,in_stack_00000184,in_stack_00000178,in_stack_00000174,
                     in_stack_00000168,in_stack_00000160,in_stack_00000158,in_stack_000001a0);
  return bVar1;
}

Assistant:

bool ImGui::DragScalar(const char* label, ImGuiDataType data_type, void* p_data, float v_speed, const void* p_min, const void* p_max, const char* format, float power)
{
    ImGuiSliderFlags drag_flags = ImGuiSliderFlags_None;
    if (power != 1.0f)
    {
        IM_ASSERT(power == 1.0f && "Call function with ImGuiSliderFlags_Logarithmic flags instead of using the old 'float power' function!");
        IM_ASSERT(p_min != NULL && p_max != NULL);  // When using a power curve the drag needs to have known bounds
        drag_flags |= ImGuiSliderFlags_Logarithmic;   // Fallback for non-asserting paths
    }
    return DragScalar(label, data_type, p_data, v_speed, p_min, p_max, format, drag_flags);
}